

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

int get_force_zeromv_skip_flag_for_blk(AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize)

{
  BLOCK_SIZE BVar1;
  uint uVar2;
  MACROBLOCKD *xd_00;
  buf_2d *dst;
  long lVar3;
  long lVar4;
  BLOCK_SIZE in_DL;
  long in_RSI;
  long *in_RDI;
  uint plane_sad;
  BLOCK_SIZE bs;
  macroblockd_plane *pd;
  macroblock_plane *p;
  int plane;
  buf_2d yv12_mb [3];
  scale_factors *sf;
  YV12_BUFFER_CONFIG *yv12;
  uint thresh_exit_part [3];
  uint thresh_exit_part_uv;
  uint thresh_exit_part_y;
  MACROBLOCKD *xd;
  int num_planes;
  AV1_COMMON *cm;
  MV_REFERENCE_FRAME in_stack_ffffffffffffff1f;
  AV1_COMMON *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  MV_REFERENCE_FRAME ref_frame;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  int iVar5;
  undefined8 local_c8 [3];
  undefined4 auStack_b0 [13];
  int in_stack_ffffffffffffff84;
  scale_factors *in_stack_ffffffffffffff88;
  scale_factors *in_stack_ffffffffffffff90;
  YV12_BUFFER_CONFIG *in_stack_ffffffffffffff98;
  uint local_4c [4];
  uint local_3c;
  long local_38;
  int local_2c;
  AV1_COMMON *local_28;
  BLOCK_SIZE local_19;
  long local_18;
  long *local_10;
  int local_4;
  
  ref_frame = (MV_REFERENCE_FRAME)((ulong)in_stack_ffffffffffffff28 >> 0x38);
  if (*(int *)(in_RSI + 0x15240) < 2) {
    local_4 = *(int *)(in_RSI + 0x15240);
  }
  else {
    local_28 = (AV1_COMMON *)(in_RDI + 0x77f0);
    if (in_DL == *(BLOCK_SIZE *)(in_RDI[0x8401] + 0x1c)) {
      local_4 = 0;
    }
    else {
      local_19 = in_DL;
      local_18 = in_RSI;
      local_10 = in_RDI;
      local_2c = av1_num_planes(local_28);
      local_38 = local_18 + 0x1a0;
      local_4c[0] = *(uint *)((long)local_10 + (ulong)local_19 * 4 + 0x9d6ac);
      local_4c[1] = local_4c[0] * 3 >> 2;
      local_4c[2] = local_4c[1];
      local_4c[3] = local_4c[1];
      local_3c = local_4c[0];
      xd_00 = (MACROBLOCKD *)
              get_ref_frame_yv12_buf
                        ((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30)
                         ,ref_frame);
      dst = (buf_2d *)
            get_ref_scale_factors_const(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1f);
      av1_setup_pred_block
                (xd_00,dst,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                 in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
      for (iVar5 = 0; iVar5 < local_2c; iVar5 = iVar5 + 1) {
        lVar3 = local_18 + (long)iVar5 * 0x88;
        lVar4 = local_38 + 0x10 + (long)iVar5 * 0xa30;
        BVar1 = get_plane_block_size(local_19,*(int *)(lVar4 + 4),*(int *)(lVar4 + 8));
        uVar2 = (**(code **)(*local_10 + 0xc900 + (ulong)BVar1 * 0x70))
                          (*(undefined8 *)(lVar3 + 0x30),*(undefined4 *)(lVar3 + 0x48),
                           local_c8[(long)iVar5 * 4],auStack_b0[(long)iVar5 * 8]);
        if (local_4c[iVar5] <= uVar2) {
          return 0;
        }
      }
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int get_force_zeromv_skip_flag_for_blk(const AV1_COMP *cpi,
                                              const MACROBLOCK *x,
                                              BLOCK_SIZE bsize) {
  // Force zero MV skip based on SB level decision
  if (x->force_zeromv_skip_for_sb < 2) return x->force_zeromv_skip_for_sb;

  // For blocks of size equal to superblock size, the decision would have been
  // already done at superblock level. Hence zeromv-skip decision is skipped.
  const AV1_COMMON *const cm = &cpi->common;
  if (bsize == cm->seq_params->sb_size) return 0;

  const int num_planes = av1_num_planes(cm);
  const MACROBLOCKD *const xd = &x->e_mbd;
  const unsigned int thresh_exit_part_y =
      cpi->zeromv_skip_thresh_exit_part[bsize];
  const unsigned int thresh_exit_part_uv =
      CALC_CHROMA_THRESH_FOR_ZEROMV_SKIP(thresh_exit_part_y);
  const unsigned int thresh_exit_part[MAX_MB_PLANE] = { thresh_exit_part_y,
                                                        thresh_exit_part_uv,
                                                        thresh_exit_part_uv };
  const YV12_BUFFER_CONFIG *const yv12 = get_ref_frame_yv12_buf(cm, LAST_FRAME);
  const struct scale_factors *const sf =
      get_ref_scale_factors_const(cm, LAST_FRAME);

  struct buf_2d yv12_mb[MAX_MB_PLANE];
  av1_setup_pred_block(xd, yv12_mb, yv12, sf, sf, num_planes);

  for (int plane = 0; plane < num_planes; ++plane) {
    const struct macroblock_plane *const p = &x->plane[plane];
    const struct macroblockd_plane *const pd = &xd->plane[plane];
    const BLOCK_SIZE bs =
        get_plane_block_size(bsize, pd->subsampling_x, pd->subsampling_y);
    const unsigned int plane_sad = cpi->ppi->fn_ptr[bs].sdf(
        p->src.buf, p->src.stride, yv12_mb[plane].buf, yv12_mb[plane].stride);
    assert(plane < MAX_MB_PLANE);
    if (plane_sad >= thresh_exit_part[plane]) return 0;
  }
  return 1;
}